

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O1

xmlNodePtr xmlSchematronNextNode(xmlNodePtr cur)

{
  xmlNodePtr pxVar1;
  
  pxVar1 = cur->children;
  if (((pxVar1 == (xmlNodePtr)0x0) || (pxVar1->type == XML_ENTITY_DECL)) ||
     (cur = pxVar1, pxVar1->type == XML_DTD_NODE)) {
    for (pxVar1 = cur->next; pxVar1 != (xmlNodePtr)0x0; pxVar1 = pxVar1->next) {
      if ((pxVar1->type != XML_ENTITY_DECL) && (pxVar1->type != XML_DTD_NODE)) {
        return pxVar1;
      }
      cur = pxVar1;
    }
    do {
      cur = cur->parent;
      if (cur == (_xmlNode *)0x0) {
        return (xmlNodePtr)0x0;
      }
      if (cur->type == XML_DOCUMENT_NODE) {
        return (xmlNodePtr)0x0;
      }
      pxVar1 = cur->next;
    } while (pxVar1 == (_xmlNode *)0x0);
  }
  return pxVar1;
}

Assistant:

static xmlNodePtr
xmlSchematronNextNode(xmlNodePtr cur) {
    if (cur->children != NULL) {
	/*
	 * Do not descend on entities declarations
	 */
	if (cur->children->type != XML_ENTITY_DECL) {
	    cur = cur->children;
	    /*
	     * Skip DTDs
	     */
	    if (cur->type != XML_DTD_NODE)
		return(cur);
	}
    }

    while (cur->next != NULL) {
	cur = cur->next;
	if ((cur->type != XML_ENTITY_DECL) &&
	    (cur->type != XML_DTD_NODE))
	    return(cur);
    }

    do {
	cur = cur->parent;
	if (cur == NULL) break;
	if (cur->type == XML_DOCUMENT_NODE) return(NULL);
	if (cur->next != NULL) {
	    cur = cur->next;
	    return(cur);
	}
    } while (cur != NULL);
    return(cur);
}